

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_transaction.cpp
# Opt level: O0

void __thiscall
Transaction_CommitTwoSeparateTransactions_Test::~Transaction_CommitTwoSeparateTransactions_Test
          (Transaction_CommitTwoSeparateTransactions_Test *this)

{
  Transaction_CommitTwoSeparateTransactions_Test *this_local;
  
  ~Transaction_CommitTwoSeparateTransactions_Test(this);
  operator_delete(this,0x1e0);
  return;
}

Assistant:

TEST_F (Transaction, CommitTwoSeparateTransactions) {
    // Append two individual transactions, each containing a single int.
    {
        pstore::database db{store_.file ()};
        db.set_vacuum_mode (pstore::database::vacuum_mode::disabled);
        mock_mutex mutex;
        {
            auto t1 = begin (db, mock_lock (mutex));
            append_int (t1, 1);
            t1.commit ();
        }
        {
            auto t2 = begin (db, mock_lock (mutex));
            append_int (t2, 2);
            t2.commit ();
        }
    }

    std::size_t footer2 = pstore::leader_size;
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));
    footer2 += sizeof (pstore::trailer);

    footer2 += pstore::calc_alignment (footer2, alignof (int));
    footer2 += sizeof (int);
    footer2 += pstore::calc_alignment (footer2, alignof (pstore::trailer));

    pstore::header const * const header = this->get_header ();
    EXPECT_EQ (pstore::typed_address<pstore::trailer>::make (footer2), header->footer_pos.load ());
}